

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

void testing::Cardinality::DescribeActualCallCountTo(int actual_call_count,ostream *os)

{
  ostream *poVar1;
  ostream *in_RSI;
  int in_EDI;
  int in_stack_0000016c;
  string local_30 [48];
  
  if (in_EDI < 1) {
    std::operator<<(in_RSI,"never called");
  }
  else {
    poVar1 = std::operator<<(in_RSI,"called ");
    (anonymous_namespace)::FormatTimes_abi_cxx11_(in_stack_0000016c);
    std::operator<<(poVar1,local_30);
    std::__cxx11::string::~string(local_30);
  }
  return;
}

Assistant:

void Cardinality::DescribeActualCallCountTo(int actual_call_count,
                                            ::std::ostream* os) {
  if (actual_call_count > 0) {
    *os << "called " << FormatTimes(actual_call_count);
  } else {
    *os << "never called";
  }
}